

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void StartEventThrd(ALCcontext *ctx)

{
  thread tStack_18;
  ALCcontext *ctx_local;
  
  ctx_local = ctx;
  std::thread::thread<int(&)(ALCcontext*),ALCcontext*&,void>(&tStack_18,EventThread,&ctx_local);
  std::thread::operator=(&ctx_local->mEventThread,&tStack_18);
  std::thread::~thread(&tStack_18);
  return;
}

Assistant:

void StartEventThrd(ALCcontext *ctx)
{
    try {
        ctx->mEventThread = std::thread{EventThread, ctx};
    }
    catch(std::exception& e) {
        ERR("Failed to start event thread: %s\n", e.what());
    }
    catch(...) {
        ERR("Failed to start event thread! Expect problems.\n");
    }
}